

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transformable.cpp
# Opt level: O2

Transform * __thiscall sf::Transformable::getTransform(Transformable *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float a00;
  float fVar5;
  Transform local_50;
  
  if (this->m_transformNeedUpdate == true) {
    fVar2 = (this->m_rotation * -3.1415927) / 180.0;
    fVar3 = cosf(fVar2);
    fVar4 = sinf(fVar2);
    fVar2 = (this->m_scale).x;
    a00 = fVar3 * fVar2;
    fVar5 = (this->m_scale).y;
    fVar3 = fVar3 * fVar5;
    fVar2 = fVar2 * fVar4;
    fVar5 = fVar5 * fVar4;
    fVar4 = (this->m_origin).x;
    fVar1 = (this->m_origin).y;
    Transform::Transform
              (&local_50,a00,fVar5,(-fVar4 * a00 - fVar5 * fVar1) + (this->m_position).x,-fVar2,
               fVar3,(fVar4 * fVar2 - fVar1 * fVar3) + (this->m_position).y,0.0,0.0,1.0);
    *(undefined8 *)((this->m_transform).m_matrix + 0xc) = local_50.m_matrix._48_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 0xe) = local_50.m_matrix._56_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 8) = local_50.m_matrix._32_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 10) = local_50.m_matrix._40_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 4) = local_50.m_matrix._16_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 6) = local_50.m_matrix._24_8_;
    *(undefined8 *)(this->m_transform).m_matrix = local_50.m_matrix._0_8_;
    *(undefined8 *)((this->m_transform).m_matrix + 2) = local_50.m_matrix._8_8_;
    this->m_transformNeedUpdate = false;
  }
  return &this->m_transform;
}

Assistant:

const Transform& Transformable::getTransform() const
{
    // Recompute the combined transform if needed
    if (m_transformNeedUpdate)
    {
        float angle  = -m_rotation * 3.141592654f / 180.f;
        float cosine = static_cast<float>(std::cos(angle));
        float sine   = static_cast<float>(std::sin(angle));
        float sxc    = m_scale.x * cosine;
        float syc    = m_scale.y * cosine;
        float sxs    = m_scale.x * sine;
        float sys    = m_scale.y * sine;
        float tx     = -m_origin.x * sxc - m_origin.y * sys + m_position.x;
        float ty     =  m_origin.x * sxs - m_origin.y * syc + m_position.y;

        m_transform = Transform( sxc, sys, tx,
                                -sxs, syc, ty,
                                 0.f, 0.f, 1.f);
        m_transformNeedUpdate = false;
    }

    return m_transform;
}